

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O1

double __thiscall
cuckoocache_tests::HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (HitRateTest *this,size_t megabytes,double load)

{
  pointer puVar1;
  uchar *puVar2;
  uint256 *h_1;
  uint64_t uVar3;
  pointer puVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint256 *h;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  vector<uint256,_std::allocator<uint256>_> local_110;
  vector<uint256,_std::allocator<uint256>_> local_f8;
  cache<uint256,_SignatureCacheHasher> local_d8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint local_58 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_d8);
  uVar11 = (megabytes & 0xfffffffffff) << 0xf;
  uVar5 = 0xffffffff;
  if (uVar11 < 0xffffffff) {
    uVar5 = uVar11;
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup(&local_d8,(uint32_t)uVar5);
  uVar5 = (long)((double)uVar11 * load) & 0xffffffff;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&local_f8,uVar5);
  if ((int)(long)((double)uVar11 * load) != 0) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      puVar4 = local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        uVar3 = RandomMixin<FastRandomContext>::randbits<32>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>);
        *(int *)((puVar4->super_base_blob<256U>).m_data._M_elems + lVar6 * 4 + lVar12) = (int)uVar3;
        lVar6 = lVar6 + 1;
      } while ((char)lVar6 != '\b');
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar11 != uVar5);
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(&local_110,&local_f8);
  if (local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_78 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
      uStack_70 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
      local_68 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
      uStack_60 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                (&local_d8,
                 (base_blob<256U>)
                 *(base_blob<256U> *)(puVar4->super_base_blob<256U>).m_data._M_elems);
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start ==
      local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_finish) {
    dVar13 = 0.0;
  }
  else {
    uVar11 = (ulong)local_d8.size;
    uVar7 = 0;
    puVar4 = local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar8 = *(uint *)(puVar4->super_base_blob<256U>).m_data._M_elems * uVar11;
      uVar9 = uVar8 >> 0x20;
      local_58[0] = (uint)(uVar8 >> 0x20);
      local_58[1] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 4) * uVar11 >>
                         0x20);
      local_58[2] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8) * uVar11 >>
                         0x20);
      local_58[3] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0xc) * uVar11
                         >> 0x20);
      local_58[4] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10) * uVar11
                         >> 0x20);
      local_58[5] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x14) * uVar11
                         >> 0x20);
      local_58[6] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18) * uVar11
                         >> 0x20);
      local_58[7] = (int)(*(uint *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x1c) * uVar11
                         >> 0x20);
      puVar1 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      puVar2 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9].super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar16[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar16[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
      auVar16[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
      auVar16[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
      auVar16[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
      auVar16[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
      auVar16[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
      auVar16[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
      auVar16[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
      auVar16[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
      auVar16[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
      auVar16[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar16[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar16[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar16[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar16[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
      auVar14[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar2);
      auVar14[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x11] == puVar2[1]);
      auVar14[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x12] == puVar2[2]);
      auVar14[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x13] == puVar2[3]);
      auVar14[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x14] == puVar2[4]);
      auVar14[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x15] == puVar2[5]);
      auVar14[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x16] == puVar2[6]);
      auVar14[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x17] == puVar2[7]);
      auVar14[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x18] == puVar2[8]);
      auVar14[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x19] == puVar2[9]);
      auVar14[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar2[10]);
      auVar14[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar2[0xb]);
      auVar14[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar2[0xc]);
      auVar14[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar2[0xd]);
      auVar14[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar2[0xe]);
      auVar14[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar2[0xf]);
      auVar14 = auVar14 & auVar16;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        uVar10 = 1;
      }
      else {
        lVar12 = 4;
        do {
          lVar6 = lVar12;
          if (lVar6 == 0x20) break;
          puVar1 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start + *(uint *)((long)local_58 + lVar6);
          puVar2 = local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)((long)local_58 + lVar6)].
                   super_base_blob<256U>.m_data._M_elems + 0x10;
          auVar17[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
          auVar17[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[1] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
          auVar17[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[2] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
          auVar17[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[3] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
          auVar17[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[4] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
          auVar17[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[5] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
          auVar17[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[6] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
          auVar17[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[7] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
          auVar17[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[8] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
          auVar17[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[9] ==
                        (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
          auVar17[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[10] ==
                         (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
          auVar17[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xb] ==
                          (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
          auVar17[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xc] ==
                          (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
          auVar17[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xd] ==
                          (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
          auVar17[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xe] ==
                          (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
          auVar17[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0xf] ==
                          (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
          auVar15[0] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x10] == *puVar2);
          auVar15[1] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x11] == puVar2[1]);
          auVar15[2] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x12] == puVar2[2]);
          auVar15[3] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x13] == puVar2[3]);
          auVar15[4] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x14] == puVar2[4]);
          auVar15[5] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x15] == puVar2[5]);
          auVar15[6] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x16] == puVar2[6]);
          auVar15[7] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x17] == puVar2[7]);
          auVar15[8] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x18] == puVar2[8]);
          auVar15[9] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x19] == puVar2[9]);
          auVar15[10] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1a] == puVar2[10]);
          auVar15[0xb] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1b] == puVar2[0xb]);
          auVar15[0xc] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1c] == puVar2[0xc]);
          auVar15[0xd] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1d] == puVar2[0xd]);
          auVar15[0xe] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1e] == puVar2[0xe]);
          auVar15[0xf] = -((puVar4->super_base_blob<256U>).m_data._M_elems[0x1f] == puVar2[0xf]);
          auVar15 = auVar15 & auVar17;
          lVar12 = lVar6 + 4;
        } while ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff);
        uVar10 = (uint)(lVar6 != 0x20);
      }
      uVar7 = uVar7 + uVar10;
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    dVar13 = (double)uVar7;
  }
  if (local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_d8.epoch_flags.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if ((_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)
      local_d8.collection_flags.mem._M_t.
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::atomic<unsigned_char>_*,_false>)0x0) {
    operator_delete__((void *)local_d8.collection_flags.mem._M_t.
                              super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                              .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>.
                              _M_head_impl);
  }
  local_d8.collection_flags.mem._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl =
       (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
       )(__uniq_ptr_data<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>,_true,_true>
         )0x0;
  if (local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.table.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return dVar13 / (double)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

double test_cache(size_t megabytes, double load)
{
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    /** Do the insert */
    for (const uint256& h : hashes_insert_copy)
        set.insert(h);
    /** Count the hits */
    uint32_t count = 0;
    for (const uint256& h : hashes)
        count += set.contains(h, false);
    double hit_rate = ((double)count) / ((double)n_insert);
    return hit_rate;
}